

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

MetadataResult SetOutputMode(ShellState *state,char **azArg,idx_t nArg)

{
  MetadataResult MVar1;
  bool bVar2;
  char *tbl_name;
  
  MVar1 = PRINT_USAGE;
  if (nArg < 4) {
    if (nArg == 1) {
      fprintf((FILE *)state->out,"current output mode: %s\n",modeDescr[(int)state->mode]);
    }
    else {
      if (nArg == 3) {
        tbl_name = azArg[2];
      }
      else {
        tbl_name = (char *)0x0;
      }
      bVar2 = duckdb_shell::ShellState::SetOutputMode(state,azArg[1],tbl_name);
      if (!bVar2) {
        return FAIL;
      }
    }
    MVar1 = SUCCESS;
  }
  return MVar1;
}

Assistant:

MetadataResult SetOutputMode(ShellState &state, const char **azArg, idx_t nArg) {
	if (nArg > 3) {
		return MetadataResult::PRINT_USAGE;
	}
	if (nArg == 1) {
		raw_printf(state.out, "current output mode: %s\n", modeDescr[int(state.mode)]);
	} else {
		if (!state.SetOutputMode(azArg[1], nArg > 2 ? azArg[2] : nullptr)) {
			return MetadataResult::FAIL;
		}
	}
	return MetadataResult::SUCCESS;
}